

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall clickhouse::SocketHolder::Close(SocketHolder *this)

{
  int *in_RDI;
  
  if (*in_RDI != -1) {
    close(*in_RDI);
    *in_RDI = -1;
  }
  return;
}

Assistant:

void SocketHolder::Close() noexcept {
    if (handle_ != -1) {
#if defined(_win_)
        closesocket(handle_);
#else
        close(handle_);
#endif
        handle_ = -1;
    }
}